

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool __thiscall re2::CharClassBuilder::AddRange(CharClassBuilder *this,Rune lo,Rune hi)

{
  int iVar1;
  const_iterator __position;
  const_iterator __position_00;
  const_iterator __position_01;
  bool bVar2;
  bool bVar3;
  int *piVar4;
  pointer pRVar5;
  int in_EDX;
  int in_ESI;
  uint *in_RDI;
  iterator it_3;
  iterator it_2;
  iterator it_1;
  iterator it;
  Rune hi1;
  Rune lo1;
  CharClassBuilder *in_stack_fffffffffffffec8;
  key_type *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  Rune in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee8;
  Rune in_stack_fffffffffffffeec;
  set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
  *in_stack_fffffffffffffef0;
  RuneRange local_c8;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  _Self local_b0;
  RuneRange local_a8;
  _Self local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Self local_88;
  RuneRange local_80;
  _Self local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Self local_60;
  RuneRange local_58;
  _Self local_50;
  _Self local_48;
  RuneRange local_40;
  _Self local_38;
  int local_30 [4];
  int local_20;
  int local_1c;
  int local_18;
  int local_14 [4];
  bool local_1;
  
  if (in_EDX < in_ESI) {
    local_1 = false;
  }
  else {
    local_18 = in_EDX;
    local_14[0] = in_ESI;
    if ((in_ESI < 0x7b) && (0x40 < in_EDX)) {
      local_20 = 0x41;
      piVar4 = std::max<int>(local_14,&local_20);
      local_1c = *piVar4;
      local_30[2] = 0x5a;
      piVar4 = std::min<int>(&local_18,local_30 + 2);
      local_30[3] = *piVar4;
      if (local_1c <= local_30[3]) {
        *in_RDI = (1 << (((char)local_30[3] - (char)local_1c) + 1U & 0x1f)) + -1 <<
                  ((char)local_1c + 0xbfU & 0x1f) | *in_RDI;
      }
      local_30[1] = 0x61;
      piVar4 = std::max<int>(local_14,local_30 + 1);
      local_1c = *piVar4;
      local_30[0] = 0x7a;
      piVar4 = std::min<int>(&local_18,local_30);
      local_30[3] = *piVar4;
      if (local_1c <= local_30[3]) {
        in_RDI[1] = (1 << (((char)local_30[3] - (char)local_1c) + 1U & 0x1f)) + -1 <<
                    ((char)local_1c + 0x9fU & 0x1f) | in_RDI[1];
      }
    }
    RuneRange::RuneRange(&local_40,local_14[0],local_14[0]);
    local_38._M_node =
         (_Base_ptr)
         std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                   ((set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_> *)
                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                    in_stack_fffffffffffffed0);
    local_48._M_node = (_Base_ptr)end(in_stack_fffffffffffffec8);
    bVar2 = std::operator!=(&local_38,&local_48);
    bVar3 = false;
    if (bVar2) {
      pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                         ((_Rb_tree_const_iterator<re2::RuneRange> *)0x2297e5);
      iVar1 = local_18;
      bVar3 = false;
      if (pRVar5->lo <= local_14[0]) {
        pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                           ((_Rb_tree_const_iterator<re2::RuneRange> *)0x22980e);
        bVar3 = iVar1 <= pRVar5->hi;
      }
    }
    if (bVar3) {
      local_1 = false;
    }
    else {
      if (0 < local_14[0]) {
        RuneRange::RuneRange(&local_58,local_14[0] + -1,local_14[0] + -1);
        local_50._M_node =
             (_Base_ptr)
             std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                       ((set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_> *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        in_stack_fffffffffffffed0);
        local_60._M_node = (_Base_ptr)end(in_stack_fffffffffffffec8);
        bVar3 = std::operator!=(&local_50,&local_60);
        if (bVar3) {
          pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                             ((_Rb_tree_const_iterator<re2::RuneRange> *)0x2298ca);
          local_14[0] = pRVar5->lo;
          pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                             ((_Rb_tree_const_iterator<re2::RuneRange> *)0x2298e0);
          if (local_18 < pRVar5->hi) {
            pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                               ((_Rb_tree_const_iterator<re2::RuneRange> *)0x2298f9);
            local_18 = pRVar5->hi;
          }
          pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                             ((_Rb_tree_const_iterator<re2::RuneRange> *)0x229910);
          iVar1 = pRVar5->hi;
          pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                             ((_Rb_tree_const_iterator<re2::RuneRange> *)0x229924);
          in_RDI[2] = in_RDI[2] - ((iVar1 - pRVar5->lo) + 1);
          local_68 = local_50._M_node;
          __position._M_node._4_4_ = in_stack_fffffffffffffedc;
          __position._M_node._0_4_ = in_stack_fffffffffffffed8;
          local_70 = (_Base_ptr)
                     std::set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>::
                     erase_abi_cxx11_((set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
                                       *)in_stack_fffffffffffffed0,__position);
        }
      }
      if (local_18 < 0x10ffff) {
        in_stack_fffffffffffffef0 =
             (set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_> *)
             (in_RDI + 4);
        RuneRange::RuneRange(&local_80,local_18 + 1,local_18 + 1);
        local_78._M_node =
             (_Base_ptr)
             std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                       ((set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_> *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        in_stack_fffffffffffffed0);
        local_88._M_node = (_Base_ptr)end(in_stack_fffffffffffffec8);
        bVar3 = std::operator!=(&local_78,&local_88);
        if (bVar3) {
          pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                             ((_Rb_tree_const_iterator<re2::RuneRange> *)0x2299f9);
          local_18 = pRVar5->hi;
          pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                             ((_Rb_tree_const_iterator<re2::RuneRange> *)0x229a10);
          in_stack_fffffffffffffeec = pRVar5->hi;
          pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                             ((_Rb_tree_const_iterator<re2::RuneRange> *)0x229a24);
          in_RDI[2] = in_RDI[2] - ((in_stack_fffffffffffffeec - pRVar5->lo) + 1);
          local_90 = local_78._M_node;
          __position_00._M_node._4_4_ = in_stack_fffffffffffffedc;
          __position_00._M_node._0_4_ = in_stack_fffffffffffffed8;
          local_98 = (_Base_ptr)
                     std::set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>::
                     erase_abi_cxx11_((set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
                                       *)in_stack_fffffffffffffed0,__position_00);
        }
      }
      while( true ) {
        RuneRange::RuneRange(&local_a8,local_14[0],local_18);
        local_a0._M_node =
             (_Base_ptr)
             std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                       ((set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_> *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        in_stack_fffffffffffffed0);
        local_b0._M_node = (_Base_ptr)end(in_stack_fffffffffffffec8);
        bVar3 = std::operator==(&local_a0,&local_b0);
        if (bVar3) break;
        pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                           ((_Rb_tree_const_iterator<re2::RuneRange> *)0x229ae6);
        in_stack_fffffffffffffedc = pRVar5->hi;
        pRVar5 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                           ((_Rb_tree_const_iterator<re2::RuneRange> *)0x229afa);
        in_RDI[2] = in_RDI[2] - ((in_stack_fffffffffffffedc - pRVar5->lo) + 1);
        local_b8 = local_a0._M_node;
        __position_01._M_node._4_4_ = in_stack_fffffffffffffedc;
        __position_01._M_node._0_4_ = in_stack_fffffffffffffed8;
        local_c0 = (_Base_ptr)
                   std::set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>::
                   erase_abi_cxx11_((set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
                                     *)in_stack_fffffffffffffed0,__position_01);
      }
      in_RDI[2] = (local_18 - local_14[0]) + 1 + in_RDI[2];
      RuneRange::RuneRange(&local_c8,local_14[0],local_18);
      std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::insert
                (in_stack_fffffffffffffef0,
                 (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool CharClassBuilder::AddRange(Rune lo, Rune hi) {
  if (hi < lo)
    return false;

  if (lo <= 'z' && hi >= 'A') {
    // Overlaps some alpha, maybe not all.
    // Update bitmaps telling which ASCII letters are in the set.
    Rune lo1 = std::max<Rune>(lo, 'A');
    Rune hi1 = std::min<Rune>(hi, 'Z');
    if (lo1 <= hi1)
      upper_ |= ((1 << (hi1 - lo1 + 1)) - 1) << (lo1 - 'A');

    lo1 = std::max<Rune>(lo, 'a');
    hi1 = std::min<Rune>(hi, 'z');
    if (lo1 <= hi1)
      lower_ |= ((1 << (hi1 - lo1 + 1)) - 1) << (lo1 - 'a');
  }

  {  // Check whether lo, hi is already in the class.
    iterator it = ranges_.find(RuneRange(lo, lo));
    if (it != end() && it->lo <= lo && hi <= it->hi)
      return false;
  }

  // Look for a range abutting lo on the left.
  // If it exists, take it out and increase our range.
  if (lo > 0) {
    iterator it = ranges_.find(RuneRange(lo-1, lo-1));
    if (it != end()) {
      lo = it->lo;
      if (it->hi > hi)
        hi = it->hi;
      nrunes_ -= it->hi - it->lo + 1;
      ranges_.erase(it);
    }
  }

  // Look for a range abutting hi on the right.
  // If it exists, take it out and increase our range.
  if (hi < Runemax) {
    iterator it = ranges_.find(RuneRange(hi+1, hi+1));
    if (it != end()) {
      hi = it->hi;
      nrunes_ -= it->hi - it->lo + 1;
      ranges_.erase(it);
    }
  }

  // Look for ranges between lo and hi.  Take them out.
  // This is only safe because the set has no overlapping ranges.
  // We've already removed any ranges abutting lo and hi, so
  // any that overlap [lo, hi] must be contained within it.
  for (;;) {
    iterator it = ranges_.find(RuneRange(lo, hi));
    if (it == end())
      break;
    nrunes_ -= it->hi - it->lo + 1;
    ranges_.erase(it);
  }

  // Finally, add [lo, hi].
  nrunes_ += hi - lo + 1;
  ranges_.insert(RuneRange(lo, hi));
  return true;
}